

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

bool equilibrationScaleMatrix(HighsOptions *options,HighsLp *lp,HighsInt use_scale_strategy)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer piVar9;
  HighsOptions *pHVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char *format;
  HighsInt search_count;
  int iVar14;
  size_type sVar15;
  HighsLogType type;
  long lVar16;
  size_type __n;
  ulong uVar17;
  HighsLogOptions *pHVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  undefined1 *puVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  double dVar34;
  undefined1 *puVar35;
  double finite_infinity;
  vector<double,_std::allocator<double>_> row_max_value;
  vector<double,_std::allocator<double>_> row_min_value;
  vector<double,_std::allocator<double>_> original_row_min_value;
  vector<double,_std::allocator<double>_> original_row_max_value;
  double local_180;
  double local_178;
  double local_170;
  double local_160;
  double local_150;
  double local_128;
  double local_120;
  allocator_type local_111;
  double local_110;
  double local_108;
  double local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  value_type_conflict1 local_d8;
  HighsInt local_cc;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  HighsOptions *local_68;
  undefined1 *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar1 = lp->num_col_;
  lVar16 = (long)iVar1;
  lVar11 = (long)(lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16];
  if (lVar11 < 1) {
    local_58 = INFINITY;
    local_48 = 0.0;
  }
  else {
    local_48 = 0.0;
    local_58 = INFINITY;
    lVar12 = 0;
    do {
      dVar34 = ABS((lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar12]);
      dVar20 = dVar34;
      if (local_58 <= dVar34) {
        dVar20 = local_58;
      }
      local_58 = dVar20;
      if (dVar34 <= local_48) {
        dVar34 = local_48;
      }
      local_48 = dVar34;
      lVar12 = lVar12 + 1;
    } while (lVar11 != lVar12);
  }
  uVar2 = lp->num_row_;
  __n = (size_type)(int)uVar2;
  uStack_40 = 0;
  uStack_50 = 0;
  if (iVar1 < 1) {
    bVar19 = false;
  }
  else {
    dVar34 = INFINITY;
    lVar11 = 0;
    do {
      dVar20 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      if (((dVar20 != 0.0) || (NAN(dVar20))) && (ABS(dVar20) <= dVar34)) {
        dVar34 = ABS(dVar20);
      }
      lVar11 = lVar11 + 1;
    } while (lVar16 != lVar11);
    bVar19 = dVar34 < 0.1;
  }
  local_d8 = 1e+200;
  local_cc = use_scale_strategy;
  local_68 = options;
  dVar34 = ldexp(1.0,(options->super_HighsOptionsStruct).allowed_matrix_scale_factor);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_b0,__n,&local_d8,(allocator_type *)&local_c8);
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_16687e92154ef7ac;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c8,__n,(value_type_conflict1 *)&local_98,(allocator_type *)&local_80);
  dVar20 = 1.0 / dVar34;
  iVar14 = 0;
  do {
    if (0 < iVar1) {
      lVar11 = 0;
      do {
        dVar21 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
        puVar30 = &DAT_16687e92154ef7ac;
        puVar28 = (undefined1 *)0x6974e718d7d7625a;
        if ((bool)(dVar21 != 0.0 & bVar19)) {
          puVar30 = (undefined1 *)ABS(dVar21);
          puVar28 = puVar30;
          if (1e+200 <= (double)puVar30) {
            puVar28 = (undefined1 *)0x6974e718d7d7625a;
          }
          if ((double)puVar30 <= 1e-200) {
            puVar30 = &DAT_16687e92154ef7ac;
          }
        }
        piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = piVar5[lVar11];
        lVar12 = (long)iVar3;
        iVar4 = piVar5[lVar11 + 1];
        if (iVar3 < iVar4) {
          puVar31 = puVar30;
          do {
            puVar30 = (undefined1 *)
                      (ABS((lp->a_matrix_).value_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar12]) *
                      (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [(lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12]]);
            puVar35 = puVar30;
            if ((double)puVar28 <= (double)puVar30) {
              puVar35 = puVar28;
            }
            puVar28 = puVar35;
            if ((double)puVar30 <= (double)puVar31) {
              puVar30 = puVar31;
            }
            lVar12 = lVar12 + 1;
            puVar31 = puVar30;
          } while (iVar4 != lVar12);
        }
        dVar21 = (double)puVar30 * (double)puVar28;
        if (dVar21 < 0.0) {
          dVar21 = sqrt(dVar21);
        }
        else {
          dVar21 = SQRT(dVar21);
        }
        lVar12 = lVar11 + 1;
        dVar23 = 1.0 / dVar21;
        if (1.0 / dVar21 <= dVar20) {
          dVar23 = dVar20;
        }
        dVar21 = dVar34;
        if (dVar23 <= dVar34) {
          dVar21 = dVar23;
        }
        pdVar6 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar11] = dVar21;
        piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = piVar5[lVar11];
        lVar13 = (long)iVar3;
        iVar4 = piVar5[lVar12];
        if (iVar3 < iVar4) {
          piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            dVar21 = ABS(pdVar7[lVar13]) * pdVar6[lVar11];
            iVar3 = piVar5[lVar13];
            dVar23 = dVar21;
            if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3] <= dVar21) {
              dVar23 = local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar3];
            }
            local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] = dVar23;
            if (dVar21 <= local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar3]) {
              dVar21 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar3];
            }
            local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] = dVar21;
            lVar13 = lVar13 + 1;
          } while (iVar4 != lVar13);
        }
        lVar11 = lVar12;
      } while (lVar12 != lVar16);
    }
    if (0 < (int)uVar2) {
      uVar17 = 0;
      do {
        dVar21 = local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17] *
                 local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
        if (dVar21 < 0.0) {
          dVar21 = sqrt(dVar21);
        }
        else {
          dVar21 = SQRT(dVar21);
        }
        dVar23 = 1.0 / dVar21;
        if (1.0 / dVar21 <= dVar20) {
          dVar23 = dVar20;
        }
        dVar21 = dVar34;
        if (dVar23 <= dVar34) {
          dVar21 = dVar23;
        }
        (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar17] = dVar21;
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_b0,__n,&local_d8);
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&DAT_16687e92154ef7ac;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_c8,__n,(value_type_conflict1 *)&local_98);
    iVar14 = iVar14 + 1;
  } while (iVar14 != 6);
  local_f0 = (undefined1 *)0x6974e718d7d7625a;
  local_f8 = &DAT_16687e92154ef7ac;
  if (0 < iVar1) {
    local_f8 = &DAT_16687e92154ef7ac;
    local_f0 = (undefined1 *)0x6974e718d7d7625a;
    lVar11 = 0;
    do {
      dVar34 = log((lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11]);
      dVar34 = floor(dVar34 / 0.6931471805599453 + 0.5);
      puVar30 = (undefined1 *)exp2(dVar34);
      (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar11] = (double)puVar30;
      if ((double)puVar30 <= (double)local_f0) {
        local_f0 = puVar30;
      }
      if ((double)local_f8 <= (double)puVar30) {
        local_f8 = puVar30;
      }
      lVar11 = lVar11 + 1;
    } while (lVar16 != lVar11);
  }
  local_e0 = &DAT_16687e92154ef7ac;
  local_e8 = (undefined1 *)0x6974e718d7d7625a;
  if (0 < (int)uVar2) {
    local_e0 = &DAT_16687e92154ef7ac;
    local_e8 = (undefined1 *)0x6974e718d7d7625a;
    uVar17 = 0;
    do {
      dVar34 = log((lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17]);
      dVar34 = floor(dVar34 / 0.6931471805599453 + 0.5);
      puVar30 = (undefined1 *)exp2(dVar34);
      (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17] = (double)puVar30;
      if ((double)puVar30 <= (double)local_e8) {
        local_e8 = puVar30;
      }
      if ((double)local_e0 <= (double)puVar30) {
        local_e0 = puVar30;
      }
      uVar17 = uVar17 + 1;
    } while (uVar2 != uVar17);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98,__n,&local_d8,(allocator_type *)&local_80);
  local_60 = &DAT_16687e92154ef7ac;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_80,__n,(value_type_conflict1 *)&local_60,&local_111);
  std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_b0,__n,&local_d8);
  local_60 = &DAT_16687e92154ef7ac;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&local_c8,__n,(value_type_conflict1 *)&local_60);
  local_178 = 0.0;
  puVar28 = (undefined1 *)0x6974e718d7d7625a;
  local_128 = 1e+200;
  local_108 = 0.0;
  local_180 = 0.0;
  local_100 = 1e+200;
  puVar30 = (undefined1 *)0x0;
  local_120 = 1e+200;
  dVar34 = 0.0;
  local_150 = 0.0;
  if (0 < iVar1) {
    lVar11 = 0;
    local_150 = 0.0;
    local_100 = 1e+200;
    local_180 = 0.0;
    local_128 = 1e+200;
    puVar31 = (undefined1 *)0x6974e718d7d7625a;
    puVar35 = (undefined1 *)0x0;
    do {
      piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar14 = piVar5[lVar11];
      lVar12 = (long)iVar14;
      iVar3 = piVar5[lVar11 + 1];
      puVar28 = (undefined1 *)0x6974e718d7d7625a;
      puVar30 = &DAT_16687e92154ef7ac;
      dVar20 = 1.0;
      if (iVar14 < iVar3) {
        piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar29 = &DAT_16687e92154ef7ac;
        puVar30 = &DAT_16687e92154ef7ac;
        puVar22 = (undefined1 *)0x6974e718d7d7625a;
        puVar28 = (undefined1 *)0x6974e718d7d7625a;
        do {
          iVar14 = piVar5[lVar12];
          puVar32 = (undefined1 *)ABS(pdVar6[lVar12]);
          if ((double)puVar32 <= (double)puVar22) {
            puVar22 = puVar32;
          }
          puVar33 = puVar32;
          if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar14] <= (double)puVar32) {
            puVar33 = (undefined1 *)
                      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar14];
          }
          if ((double)puVar29 <= (double)puVar32) {
            puVar29 = puVar32;
          }
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar14] = (double)puVar33;
          if ((double)puVar32 <=
              local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar14]) {
            puVar32 = (undefined1 *)
                      local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar14];
          }
          local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar14] = (double)puVar32;
          dVar20 = pdVar7[lVar11] * pdVar8[iVar14] * pdVar6[lVar12];
          pdVar6[lVar12] = dVar20;
          puVar32 = (undefined1 *)ABS(dVar20);
          if ((double)puVar32 <= (double)puVar28) {
            puVar28 = puVar32;
          }
          if ((double)puVar30 <= (double)puVar32) {
            puVar30 = puVar32;
          }
          puVar33 = puVar32;
          if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar14] <= (double)puVar32) {
            puVar33 = (undefined1 *)
                      local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar14];
          }
          local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar14] = (double)puVar33;
          if ((double)puVar32 <=
              local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar14]) {
            puVar32 = (undefined1 *)
                      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar14];
          }
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar14] = (double)puVar32;
          lVar12 = lVar12 + 1;
        } while (iVar3 != lVar12);
        dVar20 = (double)puVar22 * (double)puVar29;
      }
      if (dVar20 < 0.0) {
        dVar20 = sqrt(dVar20);
      }
      else {
        dVar20 = SQRT(dVar20);
      }
      dVar20 = 1.0 / dVar20;
      dVar21 = log(dVar20);
      dVar23 = (double)puVar28 * (double)puVar30;
      if (dVar23 < 0.0) {
        dVar23 = sqrt(dVar23);
      }
      else {
        dVar23 = SQRT(dVar23);
      }
      lVar11 = lVar11 + 1;
      if ((double)puVar31 <= (double)puVar28) {
        puVar28 = puVar31;
      }
      if ((double)puVar30 <= (double)puVar35) {
        puVar30 = puVar35;
      }
      if (dVar20 <= local_100) {
        local_100 = dVar20;
      }
      local_150 = local_150 + dVar21;
      if (local_180 <= dVar20) {
        local_180 = dVar20;
      }
      dVar23 = 1.0 / dVar23;
      if (dVar23 <= local_128) {
        local_128 = dVar23;
      }
      dVar20 = log(dVar23);
      dVar34 = dVar34 + dVar20;
      if (local_108 <= dVar23) {
        local_108 = dVar23;
      }
      puVar31 = puVar28;
      puVar35 = puVar30;
    } while (lVar11 != lVar16);
  }
  dVar20 = 0.0;
  local_160 = 1e+200;
  dVar21 = 0.0;
  local_170 = 0.0;
  if (0 < (int)uVar2) {
    sVar15 = 0;
    local_170 = 0.0;
    local_160 = 1e+200;
    local_120 = 1e+200;
    local_178 = 0.0;
    do {
      dVar23 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar15] *
               local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar15];
      if (dVar23 < 0.0) {
        dVar23 = sqrt(dVar23);
      }
      else {
        dVar23 = SQRT(dVar23);
      }
      dVar23 = 1.0 / dVar23;
      dVar24 = log(dVar23);
      dVar25 = local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar15] *
               local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar15];
      if (dVar25 < 0.0) {
        local_110 = dVar24;
        dVar25 = sqrt(dVar25);
        dVar24 = local_110;
      }
      else {
        dVar25 = SQRT(dVar25);
      }
      if (dVar23 <= local_160) {
        local_160 = dVar23;
      }
      local_170 = local_170 + dVar24;
      if (local_178 <= dVar23) {
        local_178 = dVar23;
      }
      dVar25 = 1.0 / dVar25;
      if (dVar25 <= local_120) {
        local_120 = dVar25;
      }
      dVar23 = log(dVar25);
      dVar21 = dVar21 + dVar23;
      if (dVar20 <= dVar25) {
        dVar20 = dVar25;
      }
      sVar15 = sVar15 + 1;
    } while (__n != sVar15);
  }
  dVar23 = exp(local_150 / (double)iVar1);
  local_110 = (double)(int)uVar2;
  dVar24 = exp(local_170 / local_110);
  dVar34 = exp(dVar34 / (double)iVar1);
  dVar21 = exp(dVar21 / local_110);
  pHVar10 = local_68;
  if ((local_68->super_HighsOptionsStruct).log_dev_level != 0) {
    pHVar18 = &(local_68->super_HighsOptionsStruct).log_options;
    highsLogDev(pHVar18,kInfo,
                "Scaling: Original equilibration: min/mean/max %11.4g/%11.4g/%11.4g (cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n"
                ,local_100,dVar23,local_180,local_160,dVar24,local_178);
    highsLogDev(pHVar18,kInfo,
                "Scaling: Final    equilibration: min/mean/max %11.4g/%11.4g/%11.4g (cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n"
                ,local_128,dVar34,local_108,local_120,dVar21,dVar20);
  }
  dVar25 = 1.0 / dVar23;
  if (1.0 / dVar23 <= dVar23) {
    dVar25 = dVar23;
  }
  dVar23 = 1.0 / dVar24;
  if (1.0 / dVar24 <= dVar24) {
    dVar23 = dVar24;
  }
  dVar24 = 1.0 / dVar34;
  if (1.0 / dVar34 <= dVar34) {
    dVar24 = dVar34;
  }
  dVar34 = 1.0 / dVar21;
  if (1.0 / dVar21 <= dVar21) {
    dVar34 = dVar21;
  }
  local_110 = dVar24 * dVar34;
  dVar21 = (dVar25 * dVar23) / local_110;
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    dVar21 = SQRT(dVar21);
  }
  dVar20 = (local_180 / local_100 + local_178 / local_160) /
           (local_108 / local_128 + dVar20 / local_120);
  dVar26 = local_48 / local_58;
  dVar27 = dVar26 / ((double)puVar30 / (double)puVar28);
  if ((pHVar10->super_HighsOptionsStruct).log_dev_level != 0) {
    pHVar18 = &(pHVar10->super_HighsOptionsStruct).log_options;
    highsLogDev(pHVar18,kInfo,
                "Scaling: Extreme equilibration improvement =      ( %11.4g + %11.4g) / ( %11.4g + %11.4g)  =      %11.4g / %11.4g  = %11.4g\n"
                ,local_180 / local_100);
    highsLogDev(pHVar18,kInfo,
                "Scaling: Mean    equilibration improvement = sqrt(( %11.4g * %11.4g) / ( %11.4g * %11.4g)) = sqrt(%11.4g / %11.4g) = %11.4g\n"
                ,dVar25,dVar23,dVar24,dVar34,dVar25 * dVar23,local_110,dVar21);
    highsLogDev(pHVar18,kInfo,
                "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, %0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n"
                ,puVar28,puVar30,(double)puVar30 / (double)puVar28,local_58,local_48,dVar26,dVar27);
    highsLogDev(pHVar18,kInfo,"Scaling: Improves    mean equilibration by a factor %0.4g\n",dVar21);
    highsLogDev(pHVar18,kInfo,"Scaling: Improves extreme equilibration by a factor %0.4g\n",dVar20);
    highsLogDev(pHVar18,kInfo,"Scaling: Improves max/min matrix values by a factor %0.4g\n",dVar27);
  }
  bVar19 = local_cc == 3;
  dVar34 = dVar20 * dVar21 * dVar27;
  if (1.0 <= dVar34 || bVar19) {
    if ((pHVar10->super_HighsOptionsStruct).log_dev_level == 0) goto LAB_00244983;
    pHVar18 = &(pHVar10->super_HighsOptionsStruct).log_options;
    highsLogDev(pHVar18,kInfo,
                "Scaling: Factors are in [%0.4g, %0.4g] for columns and in [%0.4g, %0.4g] for rows\n"
                ,local_f0,local_f8,local_e8,local_e0);
    highsLogDev(pHVar18,kInfo,"Scaling: Improvement factor is %0.4g >= %0.4g so scale LP\n",dVar34,
                0x3ff0000000000000);
    if (dVar20 < 1.0) {
      highsLogDev(pHVar18,kWarning,"Scaling: Applying scaling with extreme improvement of %0.4g\n",
                  dVar20);
    }
    if (dVar21 < 1.0) {
      highsLogDev(pHVar18,kWarning,"Scaling: Applying scaling with mean improvement of %0.4g\n",
                  dVar21);
    }
    if (dVar27 < 1.0) {
      highsLogDev(pHVar18,kWarning,
                  "Scaling: Applying scaling with matrix value ratio improvement of %0.4g\n",dVar27)
      ;
    }
    if (10.0 <= dVar34) goto LAB_00244983;
    format = "Scaling: Applying scaling with improvement factor %0.4g < 10*(%0.4g) improvement\n";
    type = kWarning;
  }
  else {
    if (0 < iVar1) {
      piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        iVar1 = piVar5[lVar11];
        lVar12 = (long)iVar1;
        iVar14 = piVar5[lVar11 + 1];
        if (iVar1 < iVar14) {
          do {
            pdVar8[lVar12] = pdVar8[lVar12] / (pdVar6[lVar11] * pdVar7[piVar9[lVar12]]);
            lVar12 = lVar12 + 1;
          } while (iVar14 != lVar12);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar16);
    }
    if ((pHVar10->super_HighsOptionsStruct).log_dev_level == 0) goto LAB_00244983;
    format = "Scaling: Improvement factor %0.4g < %0.4g required, so no scaling applied\n";
    type = kInfo;
  }
  highsLogDev(&(pHVar10->super_HighsOptionsStruct).log_options,type,format,dVar34,0x3ff0000000000000
             );
LAB_00244983:
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 1.0 <= dVar34 || bVar19;
}

Assistant:

bool equilibrationScaleMatrix(const HighsOptions& options, HighsLp& lp,
                              const HighsInt use_scale_strategy) {
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  HighsScale& scale = lp.scale_;
  vector<double>& colScale = scale.col;
  vector<double>& rowScale = scale.row;
  vector<HighsInt>& Astart = lp.a_matrix_.start_;
  vector<HighsInt>& Aindex = lp.a_matrix_.index_;
  vector<double>& Avalue = lp.a_matrix_.value_;
  vector<double>& colCost = lp.col_cost_;

  HighsInt simplex_scale_strategy = use_scale_strategy;

  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  for (HighsInt k = 0, AnX = Astart[numCol]; k < AnX; k++) {
    double value = fabs(Avalue[k]);
    original_matrix_min_value = min(original_matrix_min_value, value);
    original_matrix_max_value = max(original_matrix_max_value, value);
  }

  // Include cost in scaling if minimum nonzero cost is less than 0.1
  double min_nonzero_cost = kHighsInf;
  for (HighsInt i = 0; i < numCol; i++) {
    if (colCost[i]) min_nonzero_cost = min(fabs(colCost[i]), min_nonzero_cost);
  }
  bool include_cost_in_scaling = false;
  include_cost_in_scaling = min_nonzero_cost < 0.1;

  // Limits on scaling factors
  double max_allow_scale;
  double min_allow_scale;
  // Now that kHighsInf =
  // std::numeric_limits<double>::infinity(), this Qi-trick doesn't
  // work so, in recognition, use the old value of kHighsInf
  const double finite_infinity = 1e200;
  max_allow_scale = pow(2.0, options.allowed_matrix_scale_factor);
  min_allow_scale = 1 / max_allow_scale;

  double min_allow_col_scale = min_allow_scale;
  double max_allow_col_scale = max_allow_scale;
  double min_allow_row_scale = min_allow_scale;
  double max_allow_row_scale = max_allow_scale;

  // Search up to 6 times
  vector<double> row_min_value(numRow, finite_infinity);
  vector<double> row_max_value(numRow, 1 / finite_infinity);
  for (HighsInt search_count = 0; search_count < 6; search_count++) {
    // Find column scale, prepare row data
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      // For column scale (find)
      double col_min_value = finite_infinity;
      double col_max_value = 1 / finite_infinity;
      double abs_col_cost = fabs(colCost[iCol]);
      if (include_cost_in_scaling && abs_col_cost != 0) {
        col_min_value = min(col_min_value, abs_col_cost);
        col_max_value = max(col_max_value, abs_col_cost);
      }
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        double value = fabs(Avalue[k]) * rowScale[Aindex[k]];
        col_min_value = min(col_min_value, value);
        col_max_value = max(col_max_value, value);
      }
      double col_equilibration = 1 / sqrt(col_min_value * col_max_value);
      // Ensure that column scale factor is not excessively large or small
      colScale[iCol] =
          min(max(min_allow_col_scale, col_equilibration), max_allow_col_scale);
      // For row scale (only collect)
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        double value = fabs(Avalue[k]) * colScale[iCol];
        row_min_value[iRow] = min(row_min_value[iRow], value);
        row_max_value[iRow] = max(row_max_value[iRow], value);
      }
    }
    // For row scale (find)
    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
      double row_equilibration =
          1 / sqrt(row_min_value[iRow] * row_max_value[iRow]);
      // Ensure that row scale factor is not excessively large or small
      rowScale[iRow] =
          min(max(min_allow_row_scale, row_equilibration), max_allow_row_scale);
    }
    row_min_value.assign(numRow, finite_infinity);
    row_max_value.assign(numRow, 1 / finite_infinity);
  }
  // Make it numerically better
  // Also determine the max and min row and column scaling factors
  double min_col_scale = finite_infinity;
  double max_col_scale = 1 / finite_infinity;
  double min_row_scale = finite_infinity;
  double max_row_scale = 1 / finite_infinity;
  const double log2 = log(2.0);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    colScale[iCol] = pow(2.0, floor(log(colScale[iCol]) / log2 + 0.5));
    min_col_scale = min(colScale[iCol], min_col_scale);
    max_col_scale = max(colScale[iCol], max_col_scale);
  }
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    rowScale[iRow] = pow(2.0, floor(log(rowScale[iRow]) / log2 + 0.5));
    min_row_scale = min(rowScale[iRow], min_row_scale);
    max_row_scale = max(rowScale[iRow], max_row_scale);
  }
  // Apply scaling to matrix and bounds
  double matrix_min_value = finite_infinity;
  double matrix_max_value = 0;
  double min_original_col_equilibration = finite_infinity;
  double sum_original_log_col_equilibration = 0;
  double max_original_col_equilibration = 0;
  double min_original_row_equilibration = finite_infinity;
  double sum_original_log_row_equilibration = 0;
  double max_original_row_equilibration = 0;
  double min_col_equilibration = finite_infinity;
  double sum_log_col_equilibration = 0;
  double max_col_equilibration = 0;
  double min_row_equilibration = finite_infinity;
  double sum_log_row_equilibration = 0;
  double max_row_equilibration = 0;
  vector<double> original_row_min_value(numRow, finite_infinity);
  vector<double> original_row_max_value(numRow, 1 / finite_infinity);
  row_min_value.assign(numRow, finite_infinity);
  row_max_value.assign(numRow, 1 / finite_infinity);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    double original_col_min_value = finite_infinity;
    double original_col_max_value = 1 / finite_infinity;
    double col_min_value = finite_infinity;
    double col_max_value = 1 / finite_infinity;
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      HighsInt iRow = Aindex[k];
      const double original_value = fabs(Avalue[k]);
      original_col_min_value = min(original_value, original_col_min_value);
      original_col_max_value = max(original_value, original_col_max_value);
      original_row_min_value[iRow] =
          min(original_row_min_value[iRow], original_value);
      original_row_max_value[iRow] =
          max(original_row_max_value[iRow], original_value);
      Avalue[k] *= (colScale[iCol] * rowScale[iRow]);
      const double value = fabs(Avalue[k]);
      col_min_value = min(value, col_min_value);
      col_max_value = max(value, col_max_value);
      row_min_value[iRow] = min(row_min_value[iRow], value);
      row_max_value[iRow] = max(row_max_value[iRow], value);
    }
    matrix_min_value = min(matrix_min_value, col_min_value);
    matrix_max_value = max(matrix_max_value, col_max_value);

    const double original_col_equilibration =
        1 / sqrt(original_col_min_value * original_col_max_value);
    min_original_col_equilibration =
        min(original_col_equilibration, min_original_col_equilibration);
    sum_original_log_col_equilibration += log(original_col_equilibration);
    max_original_col_equilibration =
        max(original_col_equilibration, max_original_col_equilibration);
    const double col_equilibration = 1 / sqrt(col_min_value * col_max_value);
    min_col_equilibration = min(col_equilibration, min_col_equilibration);
    sum_log_col_equilibration += log(col_equilibration);
    max_col_equilibration = max(col_equilibration, max_col_equilibration);
  }

  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    const double original_row_equilibration =
        1 / sqrt(original_row_min_value[iRow] * original_row_max_value[iRow]);
    min_original_row_equilibration =
        min(original_row_equilibration, min_original_row_equilibration);
    sum_original_log_row_equilibration += log(original_row_equilibration);
    max_original_row_equilibration =
        max(original_row_equilibration, max_original_row_equilibration);
    const double row_equilibration =
        1 / sqrt(row_min_value[iRow] * row_max_value[iRow]);
    min_row_equilibration = min(row_equilibration, min_row_equilibration);
    sum_log_row_equilibration += log(row_equilibration);
    max_row_equilibration = max(row_equilibration, max_row_equilibration);
  }
  const double geomean_original_col_equilibration =
      exp(sum_original_log_col_equilibration / numCol);
  const double geomean_original_row_equilibration =
      exp(sum_original_log_row_equilibration / numRow);
  const double geomean_col_equilibration =
      exp(sum_log_col_equilibration / numCol);
  const double geomean_row_equilibration =
      exp(sum_log_row_equilibration / numRow);
  if (options.log_dev_level) {
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Original equilibration: min/mean/max %11.4g/%11.4g/%11.4g "
        "(cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n",
        min_original_col_equilibration, geomean_original_col_equilibration,
        max_original_col_equilibration, min_original_row_equilibration,
        geomean_original_row_equilibration, max_original_row_equilibration);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Final    equilibration: min/mean/max %11.4g/%11.4g/%11.4g "
        "(cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n",
        min_col_equilibration, geomean_col_equilibration, max_col_equilibration,
        min_row_equilibration, geomean_row_equilibration,
        max_row_equilibration);
  }

  // Compute the mean equilibration improvement
  const double geomean_original_col =
      max(geomean_original_col_equilibration,
          1 / geomean_original_col_equilibration);
  const double geomean_original_row =
      max(geomean_original_row_equilibration,
          1 / geomean_original_row_equilibration);
  const double geomean_col =
      max(geomean_col_equilibration, 1 / geomean_col_equilibration);
  const double geomean_row =
      max(geomean_row_equilibration, 1 / geomean_row_equilibration);
  const double mean_equilibration_improvement =
      sqrt((geomean_original_col * geomean_original_row) /
           (geomean_col * geomean_row));
  // Compute the extreme equilibration improvement
  const double original_col_ratio =
      max_original_col_equilibration / min_original_col_equilibration;
  const double original_row_ratio =
      max_original_row_equilibration / min_original_row_equilibration;
  const double col_ratio = max_col_equilibration / min_col_equilibration;
  const double row_ratio = max_row_equilibration / min_row_equilibration;
  const double extreme_equilibration_improvement =
      (original_col_ratio + original_row_ratio) / (col_ratio + row_ratio);
  // Compute the max/min matrix value improvement
  const double matrix_value_ratio = matrix_max_value / matrix_min_value;
  const double original_matrix_value_ratio =
      original_matrix_max_value / original_matrix_min_value;
  const double matrix_value_ratio_improvement =
      original_matrix_value_ratio / matrix_value_ratio;
  if (options.log_dev_level) {
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Extreme equilibration improvement =      ( %11.4g + "
        "%11.4g) / ( %11.4g + %11.4g)  =      %11.4g / %11.4g  = %11.4g\n",
        original_col_ratio, original_row_ratio, col_ratio, row_ratio,
        (original_col_ratio + original_row_ratio), (col_ratio + row_ratio),
        extreme_equilibration_improvement);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Mean    equilibration improvement = sqrt(( %11.4g * "
        "%11.4g) / ( %11.4g * %11.4g)) = sqrt(%11.4g / %11.4g) = %11.4g\n",
        geomean_original_col, geomean_original_row, geomean_col, geomean_row,
        (geomean_original_col * geomean_original_row),
        (geomean_col * geomean_row), mean_equilibration_improvement);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, "
        "%0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n",
        matrix_min_value, matrix_max_value, matrix_value_ratio,
        original_matrix_min_value, original_matrix_max_value,
        original_matrix_value_ratio, matrix_value_ratio_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves    mean equilibration by a factor %0.4g\n",
                mean_equilibration_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves extreme equilibration by a factor %0.4g\n",
                extreme_equilibration_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves max/min matrix values by a factor %0.4g\n",
                matrix_value_ratio_improvement);
  }
  const bool possibly_abandon_scaling =
      simplex_scale_strategy != kSimplexScaleStrategyForcedEquilibration;
  const double improvement_factor = extreme_equilibration_improvement *
                                    mean_equilibration_improvement *
                                    matrix_value_ratio_improvement;

  const double improvement_factor_required = 1.0;
  const bool poor_improvement =
      improvement_factor < improvement_factor_required;

  // Possibly abandon scaling if it's not improved equilibration significantly
  if (possibly_abandon_scaling && poor_improvement) {
    // Unscale the matrix
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        Avalue[k] /= (colScale[iCol] * rowScale[iRow]);
      }
    }
    if (options.log_dev_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no "
                  "scaling applied\n",
                  improvement_factor, improvement_factor_required);
    return false;
  } else {
    if (options.log_dev_level) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in "
                  "[%0.4g, %0.4g] for rows\n",
                  min_col_scale, max_col_scale, min_row_scale, max_row_scale);
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor is %0.4g >= %0.4g so scale LP\n",
                  improvement_factor, improvement_factor_required);
      if (extreme_equilibration_improvement < 1.0) {
        highsLogDev(
            options.log_options, HighsLogType::kWarning,
            "Scaling: Applying scaling with extreme improvement of %0.4g\n",
            extreme_equilibration_improvement);
      }
      if (mean_equilibration_improvement < 1.0) {
        highsLogDev(
            options.log_options, HighsLogType::kWarning,
            "Scaling: Applying scaling with mean improvement of %0.4g\n",
            mean_equilibration_improvement);
      }
      if (matrix_value_ratio_improvement < 1.0) {
        highsLogDev(options.log_options, HighsLogType::kWarning,
                    "Scaling: Applying scaling with matrix value ratio "
                    "improvement of %0.4g\n",
                    matrix_value_ratio_improvement);
      }
      if (improvement_factor < 10 * improvement_factor_required) {
        highsLogDev(options.log_options, HighsLogType::kWarning,
                    "Scaling: Applying scaling with improvement factor %0.4g "
                    "< 10*(%0.4g) improvement\n",
                    improvement_factor, improvement_factor_required);
      }
    }
  }
  return true;
}